

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
handle_post_init(connection<websocketpp::config::asio::transport_config> *this,timer_ptr *post_timer
                ,init_handler *callback,error_code *ec)

{
  undefined1 uVar1;
  bool bVar2;
  element_type *peVar3;
  undefined7 in_register_00000009;
  error_code *in_RDX;
  __shared_ptr *in_RSI;
  long in_RDI;
  error_code *in_stack_ffffffffffffff68;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff70;
  error_code *in_stack_ffffffffffffff78;
  weak_ptr<void> *__args;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool local_55;
  weak_ptr<void> local_48;
  rep local_38;
  
  std::error_code::error_code<websocketpp::transport::error::value,void>
            (in_RDX,(value)((ulong)in_RSI >> 0x20));
  uVar1 = std::operator==((error_code *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
  local_55 = true;
  if (!(bool)uVar1) {
    uVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
    in_stack_ffffffffffffff87 = false;
    local_55 = (bool)in_stack_ffffffffffffff87;
    if ((bool)uVar1) {
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3147b3);
      local_38 = (rep)::asio::
                      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                      ::expires_from_now((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                                          *)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff87 =
           lib::asio::is_neg<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_>)0x3147ca);
      local_55 = (bool)in_stack_ffffffffffffff87;
    }
  }
  if (local_55 == false) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
    if (bVar2) {
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x314821);
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
      ::cancel((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                *)in_RDX);
    }
    peVar3 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x314837);
    bVar2 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                      (peVar3,0x400);
    if (bVar2) {
      peVar3 = std::
               __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x314858);
      log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                (peVar3,0x400,"asio connection handle_post_init",
                 CONCAT71(in_register_00000009,uVar1));
    }
    bVar2 = std::function::operator_cast_to_bool((function<void_(std::weak_ptr<void>)> *)0x31487d);
    if (bVar2) {
      in_stack_ffffffffffffff70 = (function<void_(const_std::error_code_&)> *)(in_RDI + 0x120);
      __args = &local_48;
      std::weak_ptr<void>::weak_ptr
                ((weak_ptr<void> *)in_stack_ffffffffffffff70,
                 (weak_ptr<void> *)in_stack_ffffffffffffff68);
      std::function<void_(std::weak_ptr<void>)>::operator()
                ((function<void_(std::weak_ptr<void>)> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),__args);
      std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x3148c7);
    }
    std::function<void_(const_std::error_code_&)>::operator()
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3147ee);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (peVar3,0x400,"post_init cancelled",CONCAT71(in_register_00000009,uVar1));
  }
  return;
}

Assistant:

void handle_post_init(timer_ptr post_timer, init_handler callback,
        lib::error_code const & ec)
    {
        if (ec == transport::error::operation_aborted ||
            (post_timer && lib::asio::is_neg(post_timer->expires_from_now())))
        {
            m_alog->write(log::alevel::devel,"post_init cancelled");
            return;
        }

        if (post_timer) {
            post_timer->cancel();
        }

        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection handle_post_init");
        }

        if (m_tcp_post_init_handler) {
            m_tcp_post_init_handler(m_connection_hdl);
        }

        callback(ec);
    }